

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

MetaIterator __thiscall rtosc::Port::MetaContainer::find(MetaContainer *this,char *str)

{
  MetaIterator MVar1;
  int iVar2;
  bool bVar3;
  MetaIterator __begin1;
  MetaIterator local_58;
  MetaIterator local_40;
  MetaIterator local_30;
  
  local_40 = begin(this);
  MetaIterator::MetaIterator(&local_30,(char *)0x0);
  bVar3 = local_40.title == local_30.title;
  if (!bVar3) {
    local_58.title = local_40.title;
    local_58.value = local_40.value;
    iVar2 = strcmp(local_40.title,str);
    if (iVar2 != 0) {
      do {
        MetaIterator::operator++(&local_40);
        bVar3 = local_40.title == local_30.title;
        if (bVar3) goto LAB_001042dc;
        local_58.title = local_40.title;
        local_58.value = local_40.value;
        iVar2 = strcmp(local_40.title,str);
      } while (iVar2 != 0);
    }
    if (!bVar3) goto LAB_001042e6;
  }
LAB_001042dc:
  MetaIterator::MetaIterator(&local_58,(char *)0x0);
LAB_001042e6:
  MVar1.value = local_58.value;
  MVar1.title = local_58.title;
  return MVar1;
}

Assistant:

Port::MetaIterator Port::MetaContainer::find(const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x;
    return NULL;
}